

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void disas_sbcd_mem(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *tcg_ctx;
  TCGv_i32 in_RAX;
  TCGv_i32 src;
  TCGv_i32 dest;
  uint regno;
  TCGv_i32 addr;
  
  tcg_ctx = s->uc->tcg_ctx;
  addr = in_RAX;
  gen_flush_flags(s);
  src = gen_ea_mode(env,s,4,insn & 7,0,tcg_ctx->NULL_QREG,(TCGv_i32 *)0x0,EA_LOADU,
                    (uint)((((s->base).tb)->flags >> 0xd & 1) == 0));
  regno = insn >> 9 & 7;
  dest = gen_ea_mode(env,s,4,regno,0,tcg_ctx->NULL_QREG,&addr,EA_LOADU,
                     (uint)((((s->base).tb)->flags >> 0xd & 1) == 0));
  bcd_sub(tcg_ctx,dest,src);
  tcg_gen_qemu_st_i32_m68k
            (s->uc->tcg_ctx,dest,addr,(ulong)((((s->base).tb)->flags >> 0xd & 1) == 0),MO_8);
  delay_set_areg(s,regno,addr,false);
  bcd_flags(tcg_ctx,dest);
  return;
}

Assistant:

DISAS_INSN(sbcd_mem)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv src, dest, addr;

    gen_flush_flags(s); /* !Z is sticky */

    /* Indirect pre-decrement load (mode 4) */

    src = gen_ea_mode(env, s, 4, REG(insn, 0), OS_BYTE,
                      tcg_ctx->NULL_QREG, NULL, EA_LOADU, IS_USER(s));
    dest = gen_ea_mode(env, s, 4, REG(insn, 9), OS_BYTE,
                       tcg_ctx->NULL_QREG, &addr, EA_LOADU, IS_USER(s));

    bcd_sub(tcg_ctx, dest, src);

    gen_ea_mode(env, s, 4, REG(insn, 9), OS_BYTE, dest, &addr,
                EA_STORE, IS_USER(s));

    bcd_flags(tcg_ctx, dest);
}